

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::detail::erase_at<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container,int pos
               )

{
  difference_type dVar1;
  range_error *this;
  __const_iterator local_50;
  char *local_38;
  char *local_30;
  char *local_28;
  iterator end;
  iterator itr;
  int pos_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container_local;
  
  end = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  (container);
  local_28 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end(container);
  if (-1 < pos) {
    local_30 = end._M_current;
    local_38 = local_28;
    dVar1 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )end._M_current,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_28);
    if (pos < dVar1) {
      std::advance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int>(&end,pos);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&end);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (container,local_50);
      return;
    }
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Cannot erase past end of range");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void erase_at(Type &container, int pos) {
      auto itr = container.begin();
      auto end = container.end();

      if (pos < 0 || std::distance(itr, end) <= pos) {
        throw std::range_error("Cannot erase past end of range");
      }

      std::advance(itr, pos);
      container.erase(itr);
    }